

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runCCDPP_MPI.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 uVar1;
  CCDPP_MPI ccdpp;
  Parameter parameter;
  char **in_stack_00000218;
  int in_stack_00000224;
  Parameter *in_stack_00000228;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  CCDPP_MPI *in_stack_fffffffffffffe60;
  CCDPP_MPI *in_stack_fffffffffffffe70;
  undefined1 local_18;
  undefined4 local_4;
  
  Parameter::Parameter((Parameter *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
  uVar1 = Parameter::create(in_stack_00000228,in_stack_00000224,in_stack_00000218);
  if ((bool)uVar1) {
    Parameter::print_parameters((Parameter *)CONCAT17(uVar1,in_stack_fffffffffffffe50));
    RandomUtil::init_seed();
    CCDPP_MPI::CCDPP_MPI((CCDPP_MPI *)ccdpp._272_8_,(Parameter *)ccdpp._264_8_);
    CCDPP_MPI::train((CCDPP_MPI *)
                     ccdpp.train_ratings.super__Vector_base<Rating,_std::allocator<Rating>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage);
    CCDPP_MPI::predict_test_data(in_stack_fffffffffffffe60);
    if ((local_18 & 1) != 0) {
      CCDPP_MPI::output((CCDPP_MPI *)ccdpp.user_item_R._M_h._M_rehash_policy._0_8_);
    }
    local_4 = 0;
    CCDPP_MPI::~CCDPP_MPI(in_stack_fffffffffffffe70);
  }
  else {
    local_4 = 1;
  }
  Parameter::~Parameter((Parameter *)CONCAT17(uVar1,in_stack_fffffffffffffe50));
  return local_4;
}

Assistant:

int main(int argc, char **argv) {
    Parameter parameter;
    if (!parameter.create(argc, argv)) {
        return 1;
    }

    parameter.print_parameters();
    RandomUtil::init_seed();

    CCDPP_MPI ccdpp(&parameter);
    ccdpp.train();
    ccdpp.predict_test_data();

    if (parameter.output) {
        ccdpp.output();
    }

    return 0;
}